

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O1

void absl::base_internal::LLA_SkiplistInsert(AllocList *head,AllocList *e,AllocList **prev)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  AllocList *pAVar4;
  ulong uVar5;
  AllocList *p;
  int iVar6;
  AllocList *pAVar7;
  
  lVar2 = (long)head->levels;
  pAVar4 = head;
  if (0 < lVar2) {
    do {
      do {
        pAVar7 = pAVar4;
        pAVar4 = pAVar7->next[lVar2 + -1];
        if (pAVar4 == (AllocList *)0x0) break;
      } while (pAVar4 < e);
      prev[lVar2 + -1] = pAVar7;
      bVar1 = 1 < lVar2;
      lVar2 = lVar2 + -1;
      pAVar4 = pAVar7;
    } while (bVar1);
  }
  iVar6 = head->levels;
  lVar2 = (long)iVar6;
  uVar3 = e->levels;
  if (iVar6 < (int)uVar3) {
    do {
      iVar6 = iVar6 + 1;
      prev[lVar2] = head;
      lVar2 = lVar2 + 1;
      head->levels = iVar6;
      uVar3 = e->levels;
    } while (lVar2 < (int)uVar3);
  }
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      e->next[uVar5] = prev[uVar5]->next[uVar5];
      prev[uVar5]->next[uVar5] = e;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  return;
}

Assistant:

static AllocList *LLA_SkiplistSearch(AllocList *head,
                                     AllocList *e, AllocList **prev) {
  AllocList *p = head;
  for (int level = head->levels - 1; level >= 0; level--) {
    for (AllocList *n; (n = p->next[level]) != nullptr && n < e; p = n) {
    }
    prev[level] = p;
  }
  return (head->levels == 0) ? nullptr : prev[0]->next[0];
}